

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_highbd_iwht4x4_16_add_sse4_1(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  longlong lVar8;
  longlong lVar9;
  undefined8 *puVar10;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  __m128i *in;
  int32_t *in_RDI;
  int iVar11;
  int iVar12;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  int iVar13;
  int iVar14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  __m128i u;
  __m128i alVar16;
  __m128i tmp [4];
  __m128i dst [2];
  __m128i e1;
  __m128i b1;
  __m128i d1;
  __m128i c1;
  __m128i a1;
  int i;
  uint16_t *dest;
  __m128i op [4];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  int local_394;
  undefined1 local_388 [8];
  undefined8 uStack_380;
  undefined1 local_378 [16];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  uint local_348;
  int local_344;
  undefined4 local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined4 local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined4 local_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  longlong local_188;
  longlong lStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  longlong lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  
  puVar10 = (undefined8 *)(in_RSI * 2);
  in = (__m128i *)local_388;
  local_348 = in_ECX;
  local_344 = in_EDX;
  load_buffer_4x4(in_RDI,in);
  local_2a8 = (longlong)local_388;
  lVar8 = local_2a8;
  uStack_2a0 = uStack_380;
  lVar9 = uStack_2a0;
  local_2ac = 2;
  local_2a8._0_4_ = local_388._0_4_;
  local_2a8._4_4_ = local_388._4_4_;
  uStack_2a0._0_4_ = local_388._8_4_;
  uStack_2a0._4_4_ = local_388._12_4_;
  auVar15 = ZEXT416(2);
  local_388._4_4_ = local_2a8._4_4_ >> auVar15;
  local_388._0_4_ = (int)local_2a8 >> auVar15;
  uStack_380._0_4_ = (int)uStack_2a0 >> auVar15;
  uStack_380._4_4_ = uStack_2a0._4_4_ >> auVar15;
  local_2c8 = local_378._0_8_;
  uVar6 = local_2c8;
  uStack_2c0 = local_378._8_8_;
  uVar7 = uStack_2c0;
  local_2cc = 2;
  local_2c8._0_4_ = local_378._0_4_;
  local_2c8._4_4_ = local_378._4_4_;
  uStack_2c0._0_4_ = local_378._8_4_;
  uStack_2c0._4_4_ = local_378._12_4_;
  auVar15 = ZEXT416(2);
  local_378._4_4_ = local_2c8._4_4_ >> auVar15;
  local_378._0_4_ = (int)local_2c8 >> auVar15;
  local_378._8_4_ = (int)uStack_2c0 >> auVar15;
  local_378._12_4_ = uStack_2c0._4_4_ >> auVar15;
  local_2e8 = local_368;
  uVar4 = local_2e8;
  uStack_2e0 = uStack_360;
  uVar5 = uStack_2e0;
  local_2ec = 2;
  local_2e8._0_4_ = (int)local_368;
  local_2e8._4_4_ = (int)((ulong)local_368 >> 0x20);
  uStack_2e0._0_4_ = (int)uStack_360;
  uStack_2e0._4_4_ = (int)((ulong)uStack_360 >> 0x20);
  auVar15 = ZEXT416(2);
  local_368 = CONCAT44(local_2e8._4_4_ >> auVar15,(int)local_2e8 >> auVar15);
  uStack_360 = CONCAT44(uStack_2e0._4_4_ >> auVar15,(int)uStack_2e0 >> auVar15);
  local_308 = local_358;
  uVar2 = local_308;
  uStack_300 = uStack_350;
  uVar3 = uStack_300;
  local_30c = 2;
  local_308._0_4_ = (int)local_358;
  local_308._4_4_ = (int)((ulong)local_358 >> 0x20);
  uStack_300._0_4_ = (int)uStack_350;
  uStack_300._4_4_ = (int)((ulong)uStack_350 >> 0x20);
  auVar15 = ZEXT416(2);
  local_358 = CONCAT44(local_308._4_4_ >> auVar15,(int)local_308 >> auVar15);
  uStack_350 = CONCAT44(uStack_300._4_4_ >> auVar15,(int)uStack_300 >> auVar15);
  local_308 = uVar2;
  uStack_300 = uVar3;
  local_2e8 = uVar4;
  uStack_2e0 = uVar5;
  local_2c8 = uVar6;
  uStack_2c0 = uVar7;
  local_2a8 = lVar8;
  uStack_2a0 = lVar9;
  for (local_394 = 0; local_394 < 2; local_394 = local_394 + 1) {
    local_268 = (longlong)local_388;
    lVar8 = local_268;
    uStack_260 = uStack_380;
    lVar9 = uStack_260;
    local_278 = local_378._0_8_;
    uVar2 = local_278;
    uStack_270 = local_378._8_8_;
    uVar3 = uStack_270;
    local_268._0_4_ = local_388._0_4_;
    local_268._4_4_ = local_388._4_4_;
    uStack_260._0_4_ = local_388._8_4_;
    uStack_260._4_4_ = local_388._12_4_;
    local_278._0_4_ = local_378._0_4_;
    local_278._4_4_ = local_378._4_4_;
    uStack_270._0_4_ = local_378._8_4_;
    uStack_270._4_4_ = local_378._12_4_;
    local_268._0_4_ = (int)local_268 + (int)local_278;
    local_268._4_4_ = local_268._4_4_ + local_278._4_4_;
    uStack_260._0_4_ = (int)uStack_260 + (int)uStack_270;
    uStack_260._4_4_ = uStack_260._4_4_ + uStack_270._4_4_;
    local_3a8 = CONCAT44(local_268._4_4_,(int)local_268);
    uStack_3a0 = CONCAT44(uStack_260._4_4_,(int)uStack_260);
    local_1c8 = local_368;
    uVar6 = local_1c8;
    uStack_1c0 = uStack_360;
    uVar7 = uStack_1c0;
    local_1d8 = local_358;
    uVar4 = local_1d8;
    uStack_1d0 = uStack_350;
    uVar5 = uStack_1d0;
    local_1c8._0_4_ = (int)local_368;
    local_1c8._4_4_ = (int)((ulong)local_368 >> 0x20);
    uStack_1c0._0_4_ = (int)uStack_360;
    uStack_1c0._4_4_ = (int)((ulong)uStack_360 >> 0x20);
    local_1d8._0_4_ = (int)local_358;
    local_1d8._4_4_ = (int)((ulong)local_358 >> 0x20);
    uStack_1d0._0_4_ = (int)uStack_350;
    uStack_1d0._4_4_ = (int)((ulong)uStack_350 >> 0x20);
    local_1c8._0_4_ = (int)local_1c8 - (int)local_1d8;
    local_1c8._4_4_ = local_1c8._4_4_ - local_1d8._4_4_;
    uStack_1c0._0_4_ = (int)uStack_1c0 - (int)uStack_1d0;
    uStack_1c0._4_4_ = uStack_1c0._4_4_ - uStack_1d0._4_4_;
    local_3c8 = CONCAT44(local_1c8._4_4_,(int)local_1c8);
    uStack_3c0 = CONCAT44(uStack_1c0._4_4_,(int)uStack_1c0);
    local_1e8 = local_3a8;
    uStack_1e0 = uStack_3a0;
    local_1f8 = local_3c8;
    uStack_1f0 = uStack_3c0;
    local_328 = CONCAT44(local_268._4_4_ - local_1c8._4_4_,(int)local_268 - (int)local_1c8);
    uStack_320 = CONCAT44(uStack_260._4_4_ - uStack_1c0._4_4_,(int)uStack_260 - (int)uStack_1c0);
    local_32c = 1;
    auVar15 = ZEXT416(1);
    iVar11 = (int)local_268 - (int)local_1c8 >> auVar15;
    iVar12 = local_268._4_4_ - local_1c8._4_4_ >> auVar15;
    iVar13 = (int)uStack_260 - (int)uStack_1c0 >> auVar15;
    iVar14 = uStack_260._4_4_ - uStack_1c0._4_4_ >> auVar15;
    local_208 = CONCAT44(iVar12,iVar11);
    uStack_200 = CONCAT44(iVar14,iVar13);
    local_218 = local_358;
    uStack_210 = uStack_350;
    local_3d8 = CONCAT44(iVar12 - local_1d8._4_4_,iVar11 - (int)local_1d8);
    uStack_3d0 = CONCAT44(iVar14 - uStack_1d0._4_4_,iVar13 - (int)uStack_1d0);
    local_228 = CONCAT44(iVar12,iVar11);
    uStack_220 = CONCAT44(iVar14,iVar13);
    local_238 = local_378._0_8_;
    uStack_230 = local_378._8_8_;
    local_3b8 = CONCAT44(iVar12 - local_278._4_4_,iVar11 - (int)local_278);
    uStack_3b0 = CONCAT44(iVar14 - uStack_270._4_4_,iVar13 - (int)uStack_270);
    local_248 = local_3a8;
    uStack_240 = uStack_3a0;
    local_258 = local_3d8;
    uStack_250 = uStack_3d0;
    local_3a8 = CONCAT44(local_268._4_4_ - (iVar12 - local_1d8._4_4_),
                         (int)local_268 - (iVar11 - (int)local_1d8));
    uStack_3a0 = CONCAT44(uStack_260._4_4_ - (iVar14 - uStack_1d0._4_4_),
                          (int)uStack_260 - (iVar13 - (int)uStack_1d0));
    local_288 = local_3c8;
    uStack_280 = uStack_3c0;
    local_298 = local_3b8;
    uStack_290 = uStack_3b0;
    local_3c8 = CONCAT44(local_1c8._4_4_ + (iVar12 - local_278._4_4_),
                         (int)local_1c8 + (iVar11 - (int)local_278));
    uStack_3c0 = CONCAT44(uStack_1c0._4_4_ + (iVar14 - uStack_270._4_4_),
                          (int)uStack_1c0 + (iVar13 - (int)uStack_270));
    uStack_380 = uStack_3a0;
    local_388 = (undefined1  [8])local_3a8;
    local_378._8_8_ = uStack_3d0;
    local_378._0_8_ = local_3d8;
    local_368 = local_3b8;
    uStack_360 = uStack_3b0;
    local_358 = local_3c8;
    uStack_350 = uStack_3c0;
    local_278 = uVar2;
    uStack_270 = uVar3;
    local_268 = lVar8;
    uStack_260 = lVar9;
    local_1d8 = uVar4;
    uStack_1d0 = uVar5;
    local_1c8 = uVar6;
    uStack_1c0 = uVar7;
    if (local_394 == 0) {
      in = (__m128i *)local_388;
      transpose_32bit_4x4((__m128i *)local_388,in);
    }
  }
  local_188 = (longlong)local_388;
  lStack_180 = uStack_380;
  local_198 = local_378._0_8_;
  uStack_190 = local_378._8_8_;
  _local_388 = (__m128i)packssdw((undefined1  [16])_local_388,local_378);
  local_1a8 = local_368;
  uStack_1a0 = uStack_360;
  local_1b8 = local_358;
  uStack_1b0 = uStack_350;
  auVar1._8_8_ = uStack_360;
  auVar1._0_8_ = local_368;
  auVar15._8_8_ = uStack_350;
  auVar15._0_8_ = local_358;
  local_378 = packssdw(auVar1,auVar15);
  local_118 = *puVar10;
  uStack_110 = 0;
  local_120 = (undefined8 *)((long)puVar10 + (long)local_344 * 2);
  local_138 = *local_120;
  uStack_130 = 0;
  uStack_c0 = 0;
  uStack_d0 = 0;
  local_140 = (undefined8 *)((long)puVar10 + (long)(local_344 * 2) * 2);
  local_158 = *local_140;
  uStack_150 = 0;
  local_160 = (undefined8 *)((long)puVar10 + (long)(local_344 * 3) * 2);
  local_178 = *local_160;
  uStack_170 = 0;
  uStack_e0 = 0;
  uStack_f0 = 0;
  local_98 = (longlong)local_388;
  lStack_90 = uStack_380;
  local_b8 = local_378._0_8_;
  uStack_b0 = local_378._8_8_;
  alVar16[0] = (ulong)local_348;
  alVar16[1] = (longlong)in;
  local_100 = puVar10;
  local_f8 = local_178;
  local_e8 = local_158;
  local_d8 = local_138;
  local_c8 = local_118;
  local_a8 = local_158;
  uStack_a0 = local_178;
  local_88 = local_118;
  uStack_80 = local_138;
  alVar16 = highbd_clamp_epi16(alVar16,local_344);
  u[0] = (ulong)local_348;
  u[1] = (longlong)in;
  highbd_clamp_epi16(u,(int)alVar16[1]);
  *puVar10 = extraout_XMM0_Qa;
  *(undefined8 *)((long)puVar10 + (long)local_344 * 2) = extraout_XMM0_Qb;
  *(undefined8 *)((long)puVar10 + (long)(local_344 * 2) * 2) = extraout_XMM0_Qa_00;
  *(undefined8 *)((long)puVar10 + (long)(local_344 * 3) * 2) = extraout_XMM0_Qb_00;
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_sse4_1(const tran_low_t *input, uint8_t *dest8,
                                      int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  __m128i op[4];
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  load_buffer_4x4(input, op);

  // Shift before-hand.
  op[0] = _mm_srai_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_srai_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_srai_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_srai_epi32(op[3], UNIT_QUANT_SHIFT);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i c1 = op[1];
    __m128i d1 = op[2];
    __m128i b1 = op[3];
    a1 = _mm_add_epi32(a1, c1);          // a1 += c1
    d1 = _mm_sub_epi32(d1, b1);          // d1 -= b1
    __m128i e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, b1);  // a1 -= b1
    d1 = _mm_add_epi32(d1, c1);  // d1 += c1

    op[0] = a1;
    op[1] = b1;
    op[2] = c1;
    op[3] = d1;
    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  // Convert to int16_t. The C code checks that we are in range.
  op[0] = _mm_packs_epi32(op[0], op[1]);
  op[1] = _mm_packs_epi32(op[2], op[3]);

  // Load uint16_t.
  __m128i dst[2];
  __m128i tmp[4];
  tmp[0] = _mm_loadl_epi64((const __m128i *)(dest + 0 * stride));
  tmp[1] = _mm_loadl_epi64((const __m128i *)(dest + 1 * stride));
  dst[0] = _mm_unpacklo_epi64(tmp[0], tmp[1]);
  tmp[2] = _mm_loadl_epi64((const __m128i *)(dest + 2 * stride));
  tmp[3] = _mm_loadl_epi64((const __m128i *)(dest + 3 * stride));
  dst[1] = _mm_unpacklo_epi64(tmp[2], tmp[3]);

  // Add to the previous results.
  dst[0] = _mm_add_epi16(dst[0], op[0]);
  dst[1] = _mm_add_epi16(dst[1], op[1]);

  // Clamp.
  dst[0] = highbd_clamp_epi16(dst[0], bd);
  dst[1] = highbd_clamp_epi16(dst[1], bd);

  // Store.
  _mm_storel_epi64((__m128i *)(dest + 0 * stride), dst[0]);
  dst[0] = _mm_srli_si128(dst[0], 8);
  _mm_storel_epi64((__m128i *)(dest + 1 * stride), dst[0]);
  _mm_storel_epi64((__m128i *)(dest + 2 * stride), dst[1]);
  dst[1] = _mm_srli_si128(dst[1], 8);
  _mm_storel_epi64((__m128i *)(dest + 3 * stride), dst[1]);
}